

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseEnd
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  int count;
  char *pcVar1;
  char *pcVar2;
  String *this_00;
  char *pcVar3;
  String SVar4;
  String *local_50;
  String local_48 [2];
  undefined1 local_28 [8];
  String counts;
  TestCase *test_case_local;
  PrettyUnitTestResultPrinter *this_local;
  
  if ((FLAGS_gtest_print_time & 1) != 0) {
    counts.length_ = (size_t)test_case;
    pcVar1 = TestCase::name(test_case);
    String::operator=(&this->test_case_name_,pcVar1);
    count = TestCase::test_to_run_count((TestCase *)counts.length_);
    SVar4 = FormatCountableNoun((testing *)local_28,count,"test","tests");
    ColoredPrintf(COLOR_GREEN,"[----------] ",SVar4.length_);
    pcVar1 = String::c_str((String *)local_28);
    pcVar2 = String::c_str(&this->test_case_name_);
    this_00 = (String *)TestCase::elapsed_time((TestCase *)counts.length_);
    local_50 = this_00;
    StreamableToString<long_long>((internal *)local_48,(longlong *)&local_50);
    pcVar3 = String::c_str(local_48);
    printf("%s from %s (%s ms total)\n\n",pcVar1,pcVar2,pcVar3);
    String::~String(this_00);
    fflush(_stdout);
    String::~String(this_00);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseEnd(const TestCase& test_case) {
  if (!GTEST_FLAG(print_time)) return;

  test_case_name_ = test_case.name();
  const internal::String counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s (%s ms total)\n\n",
         counts.c_str(), test_case_name_.c_str(),
         internal::StreamableToString(test_case.elapsed_time()).c_str());
  fflush(stdout);
}